

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nurbs.h
# Opt level: O1

Index anurbs::Nurbs::
      upper_bound<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>>
                (Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>
                 *values,Index first,Index last,double value)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  
  uVar3 = last - first;
  if (uVar3 != 0 && first <= last) {
    do {
      uVar1 = uVar3 >> 1;
      lVar2 = first + uVar1;
      if ((lVar2 < 0) ||
         ((values->
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ).
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          .m_rows.m_value <= lVar2)) {
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0xa2,
                      "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, 0>::operator[](Index) const [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
                     );
      }
      if ((values->
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ).
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          .m_data[lVar2] <= value) {
        first = lVar2 + 1;
        uVar1 = ~uVar1 + uVar3;
      }
      uVar3 = uVar1;
    } while (0 < (long)uVar1);
  }
  return first;
}

Assistant:

static Index upper_bound(TKnots values, Index first, Index last, double value)
    {
        auto count = last - first;
        Index i, step;
    
        while (count > 0) {
            i = first; 
            step = count / 2; 
            i += step;
            if (!(value < values[i])) {
                first = ++i;
                count -= step + 1;
            } else {
                count = step;
            }
        }
        return first;
    }